

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

int ucstricmp(qsizetype alen,char16_t *a,qsizetype blen,char16_t *b)

{
  long lVar1;
  char32_t cVar2;
  char32_t cVar3;
  longlong *plVar4;
  long in_RCX;
  qsizetype in_RDX;
  long in_RSI;
  qsizetype in_RDI;
  long in_FS_OFFSET;
  int diff;
  qsizetype i;
  qsizetype l;
  char32_t blast;
  char32_t alast;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  char32_t in_stack_ffffffffffffffb4;
  long local_48;
  int local_24;
  qsizetype local_18;
  qsizetype local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == in_RCX) {
    local_24 = QtMiscUtils::qt_lencmp(in_RDI,in_RDX);
  }
  else {
    local_18 = in_RDX;
    local_10 = in_RDI;
    plVar4 = qMin<long_long>(&local_10,&local_18);
    lVar1 = *plVar4;
    for (local_48 = 0; local_48 < lVar1; local_48 = local_48 + 1) {
      cVar2 = foldCase(in_stack_ffffffffffffffb4,
                       (char32_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      cVar3 = foldCase(in_stack_ffffffffffffffb4,
                       (char32_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      local_24 = cVar2 - cVar3;
      if (local_24 != 0) goto LAB_00506f1c;
      in_stack_ffffffffffffffb4 = L'\0';
    }
    if (local_48 == local_10) {
      if (local_48 == local_18) {
        local_24 = 0;
      }
      else {
        local_24 = -1;
      }
    }
    else {
      local_24 = 1;
    }
  }
LAB_00506f1c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_24;
}

Assistant:

Q_NEVER_INLINE static int ucstricmp(qsizetype alen, const char16_t *a, qsizetype blen, const char16_t *b)
{
    if (a == b)
        return qt_lencmp(alen, blen);

    char32_t alast = 0;
    char32_t blast = 0;
    qsizetype l = qMin(alen, blen);
    qsizetype i;
    for (i = 0; i < l; ++i) {
//         qDebug() << Qt::hex << alast << blast;
//         qDebug() << Qt::hex << "*a=" << *a << "alast=" << alast << "folded=" << foldCase (*a, alast);
//         qDebug() << Qt::hex << "*b=" << *b << "blast=" << blast << "folded=" << foldCase (*b, blast);
        int diff = foldCase(a[i], alast) - foldCase(b[i], blast);
        if ((diff))
            return diff;
    }
    if (i == alen) {
        if (i == blen)
            return 0;
        return -1;
    }
    return 1;
}